

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Timer.cpp
# Opt level: O0

double celero::timer::CachePerformanceFrequency(bool quiet)

{
  ostream *poVar1;
  string local_38;
  double local_18;
  double precision;
  bool quiet_local;
  
  local_18 = 0.001;
  if (!quiet) {
    precision._7_1_ = quiet;
    poVar1 = std::operator<<((ostream *)&std::cout,"Timer resolution: ");
    std::__cxx11::to_string(&local_38,local_18);
    poVar1 = std::operator<<(poVar1,(string *)&local_38);
    poVar1 = std::operator<<(poVar1," us");
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string((string *)&local_38);
  }
  return local_18;
}

Assistant:

double celero::timer::CachePerformanceFrequency(bool quiet)
{
#ifdef _WIN32
	QueryPerformanceFrequency(&QPCFrequency);
	if(QPCFrequency.QuadPart == 0)
	{
		return 0;
	}

	auto precision = ((1.0 / static_cast<double>(QPCFrequency.QuadPart)) * 1000000.0);
#else
	if(static_cast<double>(std::chrono::high_resolution_clock::period::den) == 0)
	{
		return 0;
	}

	auto precision =
		(static_cast<double>(std::chrono::high_resolution_clock::period::num) / static_cast<double>(std::chrono::high_resolution_clock::period::den))
		* 1000000.0;
#endif

	if(quiet == false)
	{
		std::cout << "Timer resolution: " << std::to_string(precision) << " us" << std::endl;
	}

	return precision;
}